

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          unsigned_short *arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,uchar *arg_3,
          uchar *arg_4,uchar *arg_5)

{
  string_view format_00;
  string_view data;
  Arg *a5;
  string local_170;
  Arg local_150;
  Arg local_120;
  Arg local_f0;
  Arg local_c0;
  Arg local_90;
  size_type local_60;
  pointer local_58;
  
  format_00._M_len = format._M_str;
  local_58 = (arg->_M_dataplus)._M_p;
  local_60 = arg->_M_string_length;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_120,*arg_1);
  local_90.piece_._M_str = (arg_2->_M_dataplus)._M_p;
  local_90.piece_._M_len = arg_2->_M_string_length;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_150,(uint)*arg_3);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_c0,(uint)*arg_4);
  a5 = (Arg *)0x1ba852;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_f0,(uint)*arg_5);
  format_00._M_str = (char *)&local_60;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_170,(lts_20250127 *)format._M_len,format_00,&local_120,&local_90,&local_150,
             &local_c0,&local_f0,a5);
  data._M_str = local_170._M_dataplus._M_p;
  data._M_len = local_170._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_170);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }